

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void __thiscall rw::World::enumerateLights(World *this,WorldLights *lightData)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  LLLink *pLVar5;
  int iVar6;
  LLLink *pLVar7;
  
  iVar6 = lightData->numDirectionals;
  iVar3 = lightData->numLocals;
  lightData->numLocals = 0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  *(undefined8 *)&(lightData->ambient).alpha = 0x3f800000;
  pLVar5 = (this->globalLights).link.next;
  while (pLVar7 = pLVar5, pLVar7 != &(this->globalLights).link) {
    pLVar5 = pLVar7->next;
    cVar1 = *(char *)((long)&pLVar7[-4].next + 1);
    if (cVar1 == '\x01') {
      iVar2 = lightData->numDirectionals;
      if (iVar2 < iVar6) {
        lightData->numDirectionals = iVar2 + 1;
        lightData->directionals[iVar2] = (Light *)(pLVar7 + -4);
      }
    }
    else if (cVar1 == '\x02') {
      (lightData->ambient).red =
           (float32)(*(float *)((long)&pLVar7[-2].prev + 4) + (float)(lightData->ambient).red);
      (lightData->ambient).green =
           (float32)(*(float *)&pLVar7[-1].next + (float)(lightData->ambient).green);
      (lightData->ambient).blue =
           (float32)(*(float *)((long)&pLVar7[-1].next + 4) + (float)(lightData->ambient).blue);
      lightData->numAmbients = lightData->numAmbients + 1;
    }
  }
  pLVar5 = (this->localLights).link.next;
  if (pLVar5 != &(this->localLights).link) {
    iVar6 = lightData->numLocals;
    lVar4 = (long)iVar6;
    if (iVar3 < iVar6) {
      iVar3 = iVar6;
    }
    do {
      iVar6 = iVar6 + 1;
      if (iVar3 == lVar4) {
        return;
      }
      pLVar7 = pLVar5->next;
      lightData->numLocals = iVar6;
      lightData->locals[lVar4] = (Light *)(pLVar5 + -4);
      lVar4 = lVar4 + 1;
      pLVar5 = pLVar7;
    } while (pLVar7 != &(this->localLights).link);
  }
  return;
}

Assistant:

void
World::enumerateLights(WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		lightData->locals[lightData->numLocals++] = l;
	}
}